

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

string * __thiscall Block::GetMerkleRoot_abi_cxx11_(string *__return_storage_ptr__,Block *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->merkle_root);
  return __return_storage_ptr__;
}

Assistant:

string Block::GetMerkleRoot() const {
    return merkle_root;
}